

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecPrintStats(Sfm_Dec_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  uint local_2c;
  int i;
  Sfm_Dec_t *p_local;
  
  printf("Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n"
         ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesChanged,
         (ulong)(uint)p->nNodesConst0,(ulong)(uint)p->nNodesConst1,p->nNodesBuf,p->nNodesInv,
         p->nNodesResyn,p->nNodesAndOr,p->nEfforts,p->nNoDecs);
  uVar1 = p->nMaxDivs;
  uVar2 = p->nMaxWin;
  uVar5 = p->nAllDivs;
  iVar7 = Abc_MaxInt(1,p->nNodesTried);
  uVar6 = p->nAllWin;
  iVar8 = Abc_MaxInt(1,p->nNodesTried);
  printf("MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n"
         ,(ulong)uVar1,(ulong)uVar2,uVar5 / (ulong)(long)iVar7 & 0xffffffff,
         uVar6 / (ulong)(long)iVar8 & 0xffffffff,(ulong)(uint)p->nSatCalls,p->nSatCallsSat,
         p->nSatCallsUnsat,p->nSatCallsOver,p->nTimeOuts);
  aVar10 = Abc_Clock();
  p->timeTotal = aVar10 - p->timeStart;
  p->timeOther = ((((p->timeTotal - p->timeLib) - p->timeWin) - p->timeCnf) - p->timeSat) -
                 p->timeTime;
  Abc_Print(1,"%s =","Lib   ");
  if (p->timeTotal == 0) {
    local_60 = 0.0;
  }
  else {
    local_60 = ((double)p->timeLib * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeLib * 1.0) / 1000000.0,local_60);
  Abc_Print(1,"%s =","Win   ");
  if (p->timeTotal == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeWin * 1.0) / 1000000.0,local_70);
  Abc_Print(1,"%s =","Cnf   ");
  if (p->timeTotal == 0) {
    local_80 = 0.0;
  }
  else {
    local_80 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCnf * 1.0) / 1000000.0,local_80);
  Abc_Print(1,"%s =","Sat   ");
  if (p->timeTotal == 0) {
    local_90 = 0.0;
  }
  else {
    local_90 = ((double)(p->timeSat - p->timeEval) * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(p->timeSat - p->timeEval) * 1.0) / 1000000.0,
            local_90);
  Abc_Print(1,"%s ="," Sat  ");
  if (p->timeTotal == 0) {
    local_a0 = 0.0;
  }
  else {
    local_a0 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_a0);
  Abc_Print(1,"%s ="," Unsat");
  if (p->timeTotal == 0) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnsat * 1.0) / 1000000.0,local_b0);
  Abc_Print(1,"%s =","Eval  ");
  if (p->timeTotal == 0) {
    local_c0 = 0.0;
  }
  else {
    local_c0 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeEval * 1.0) / 1000000.0,local_c0);
  Abc_Print(1,"%s =","Timing");
  if (p->timeTotal == 0) {
    local_d0 = 0.0;
  }
  else {
    local_d0 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTime * 1.0) / 1000000.0,local_d0);
  Abc_Print(1,"%s =","Other ");
  if (p->timeTotal == 0) {
    local_e0 = 0.0;
  }
  else {
    local_e0 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_e0);
  Abc_Print(1,"%s =","ALL   ");
  if (p->timeTotal == 0) {
    local_f0 = 0.0;
  }
  else {
    local_f0 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_f0);
  printf("Cone sizes:  ");
  for (local_2c = 0; (int)local_2c < 9; local_2c = local_2c + 1) {
    if (p->nLuckySizes[(int)local_2c] != 0) {
      printf("%d=%d  ",(ulong)local_2c,(ulong)(uint)p->nLuckySizes[(int)local_2c]);
    }
  }
  printf("  ");
  printf("Gate sizes:  ");
  for (local_2c = 0; (int)local_2c < 9; local_2c = local_2c + 1) {
    if (p->nLuckyGates[(int)local_2c] != 0) {
      printf("%d=%d  ",(ulong)local_2c,(ulong)(uint)p->nLuckyGates[(int)local_2c]);
    }
  }
  printf("\n");
  printf("Reduction:   ");
  iVar7 = p->nTotalNodesBeg;
  iVar8 = p->nTotalNodesEnd;
  uVar1 = p->nTotalNodesBeg;
  iVar3 = p->nTotalNodesBeg;
  iVar4 = p->nTotalNodesEnd;
  iVar9 = Abc_MaxInt(1,p->nTotalNodesBeg);
  printf("Nodes  %6d out of %6d (%6.2f %%)   ",((double)(iVar3 - iVar4) * 100.0) / (double)iVar9,
         (ulong)(uint)(iVar7 - iVar8),(ulong)uVar1);
  iVar7 = p->nTotalEdgesBeg;
  iVar8 = p->nTotalEdgesEnd;
  uVar1 = p->nTotalEdgesBeg;
  iVar3 = p->nTotalEdgesBeg;
  iVar4 = p->nTotalEdgesEnd;
  iVar9 = Abc_MaxInt(1,p->nTotalEdgesBeg);
  printf("Edges  %6d out of %6d (%6.2f %%)   ",((double)(iVar3 - iVar4) * 100.0) / (double)iVar9,
         (ulong)(uint)(iVar7 - iVar8),(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void Sfm_DecPrintStats( Sfm_Dec_t * p )
{
    int i;
    printf( "Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n",
        p->nTotalNodesBeg, p->nNodesTried, p->nNodesChanged, p->nNodesConst0, p->nNodesConst1, p->nNodesBuf, p->nNodesInv, p->nNodesResyn, p->nNodesAndOr, p->nEfforts, p->nNoDecs );
    printf( "MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n",
        p->nMaxDivs, p->nMaxWin, (int)(p->nAllDivs/Abc_MaxInt(1, p->nNodesTried)), (int)(p->nAllWin/Abc_MaxInt(1, p->nNodesTried)), p->nSatCalls, p->nSatCallsSat, p->nSatCallsUnsat, p->nSatCallsOver, p->nTimeOuts );

    p->timeTotal = Abc_Clock() - p->timeStart;
    p->timeOther = p->timeTotal - p->timeLib - p->timeWin - p->timeCnf - p->timeSat - p->timeTime;

    ABC_PRTP( "Lib   ", p->timeLib  ,           p->timeTotal );
    ABC_PRTP( "Win   ", p->timeWin  ,           p->timeTotal );
    ABC_PRTP( "Cnf   ", p->timeCnf  ,           p->timeTotal );
    ABC_PRTP( "Sat   ", p->timeSat-p->timeEval, p->timeTotal );
    ABC_PRTP( " Sat  ", p->timeSatSat,          p->timeTotal );
    ABC_PRTP( " Unsat", p->timeSatUnsat,        p->timeTotal );
    ABC_PRTP( "Eval  ", p->timeEval ,           p->timeTotal );
    ABC_PRTP( "Timing", p->timeTime ,           p->timeTotal );
    ABC_PRTP( "Other ", p->timeOther,           p->timeTotal );
    ABC_PRTP( "ALL   ", p->timeTotal,           p->timeTotal );

    printf( "Cone sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckySizes[i] )
            printf( "%d=%d  ", i, p->nLuckySizes[i] );
    printf( "  " );

    printf( "Gate sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckyGates[i] )
            printf( "%d=%d  ", i, p->nLuckyGates[i] );
    printf( "\n" );

    printf( "Reduction:   " );
    printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
    printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
    printf( "\n" );
}